

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O2

CHAR LocalRegionGrayValue6redict65(IplImage *pImage)

{
  INT32U IVar1;
  INT8U *pIVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  UINT count_of_gray [256];
  
  memset(count_of_gray,0,0x400);
  pIVar2 = pImage->imageData;
  IVar1 = pImage->widthStep;
  iVar7 = IVar1 * 6 + 1;
  for (iVar6 = 6; iVar6 != 0xe; iVar6 = iVar6 + 1) {
    for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
      count_of_gray[pIVar2[(uint)(iVar7 + (int)lVar8)]] =
           count_of_gray[pIVar2[(uint)(iVar7 + (int)lVar8)]] + 1;
    }
    iVar7 = iVar7 + IVar1;
  }
  uVar5 = get_best_threshold(count_of_gray);
  iVar7 = IVar1 * 6 + 1;
  bVar3 = false;
  iVar6 = 6;
  bVar4 = false;
  while( true ) {
    if (iVar6 == 0xe) {
      return '6' - !bVar3;
    }
    iVar9 = 0;
    for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
      iVar9 = (iVar9 + 1) - (uint)(uVar5 < pIVar2[(uint)(iVar7 + (int)lVar8)]);
    }
    if ((bVar4) && (iVar9 != 0)) break;
    if (bVar3 && iVar9 == 0) {
      bVar4 = true;
    }
    if (iVar9 != 0) {
      bVar3 = true;
    }
    iVar6 = iVar6 + 1;
    iVar7 = iVar7 + IVar1;
  }
  return '5';
}

Assistant:

CHAR LocalRegionGrayValue6redict65(IplImage *pImage) {
    INT32U row, col, locate_value, sum_value = 0;
    INT32U is_white = 0, white_to_black = 0;

    //    区域 [6:14,1:7]
    UINT count_of_gray[256] = {0};
    int best_threshold;

    for (row = 6; row < 14; row++) {
        for (col = 1; col < 7; col++) {
            // get the pixel,
            locate_value = pImage->imageData[row * pImage->widthStep + col];
            count_of_gray[locate_value] += 1;

        }
    }
    //    寻找 最优 二值化 阈值
    best_threshold = get_best_threshold(count_of_gray);

    for (row = 6; row < 14; row++) {
//        计算这一行 二值化后 灰度值大小
        sum_value = 0;
        for (col = 1; col < 7; col++) {
            // get the pixel
            locate_value = pImage->imageData[row * pImage->widthStep + col];
//            二值化,背景是黑色（0），前景是白色（1）
            if (locate_value <= best_threshold)
                locate_value = 1;
            else
                locate_value = 0;

            sum_value += locate_value;
        }

        if (white_to_black == 1 && sum_value > 0) {
//            白转黑 又转白
            return '5';
        }

        if (is_white == 1 && sum_value == 0) {
//            白转黑
            white_to_black = 1;
        }

        if (sum_value > 0)
            is_white = 1;

    }

    if (is_white == 0)
//        非环
        return '5';
    else
        return '6';
}